

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O2

plain_range_sorted<CGlyphIndex>
find_binary<plain_range_sorted<CGlyphIndex>,CGlyphIndex>
          (plain_range_sorted<CGlyphIndex> range,CGlyphIndex value)

{
  plain_range<CGlyphIndex> pVar1;
  CGlyphIndex *pCVar2;
  long in_FS_OFFSET;
  plain_range<CGlyphIndex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (plain_range<CGlyphIndex>)
             partition_binary<plain_range_sorted<CGlyphIndex>,CGlyphIndex>(range,value);
  pVar1 = local_28;
  if (local_28.begin < local_28.end) {
    pCVar2 = plain_range<CGlyphIndex>::front(&local_28);
    if (pCVar2->m_ID == value.m_ID) {
      pVar1 = (plain_range<CGlyphIndex>)(ZEXT816(0) << 0x40);
      if (pCVar2->m_FontSizeIndex == value.m_FontSizeIndex) {
        pVar1 = local_28;
      }
    }
    else {
      pVar1 = (plain_range<CGlyphIndex>)ZEXT816(0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (plain_range_sorted<CGlyphIndex>)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

R find_binary(R range, T value)
{
	range = partition_binary(range, value);
	if(range.empty()) return range;
	if(range.front() == value) return range;
	return R();
}